

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

int Fx_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nNewNodesMax,int LitCountMax,int fCanonDivs,
                  int fVerbose,int fVeryVerbose)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  Vec_Int_t *pVVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  int iVar10;
  Fx_Man_t *p;
  void *pvVar11;
  long lVar12;
  Vec_Wec_t *pVVar13;
  uint uVar14;
  long lVar15;
  abctime aVar16;
  int *extraout_RDX;
  int *fWarning;
  int iVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  timespec local_58;
  int local_48;
  int local_44;
  long local_40;
  size_t local_38;
  
  local_48 = fVerbose;
  local_44 = nNewNodesMax;
  iVar9 = clock_gettime(3,&local_58);
  if (iVar9 < 0) {
    local_40 = -1;
  }
  else {
    local_40 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p = Fx_ManStart(vCubes);
  p->LitCountMax = LitCountMax;
  p->fCanonDivs = fCanonDivs;
  Fx_ManCreateLiterals(p,ObjIdMax);
  Fx_ManComputeLevel(p);
  Fx_ManCreateDivisors(p);
  if ((fVeryVerbose != 0) && (p->vLits->nSize < 0x36)) {
    printf("         ");
    iVar9 = p->vLits->nSize;
    iVar17 = iVar9 / 2;
    if (1 < iVar9) {
      iVar9 = 0x1a;
      if (iVar17 < 0x1a) {
        iVar9 = iVar17;
      }
      iVar19 = 1;
      if (1 < iVar9) {
        iVar19 = iVar9;
      }
      iVar9 = 0x61;
      do {
        putchar(iVar9);
        iVar10 = iVar9 - iVar19;
        iVar9 = iVar9 + 1;
      } while (iVar10 != 0x60);
    }
    putchar(10);
    pvVar11 = calloc((long)(iVar17 + 1),1);
    pVVar13 = p->vCubes;
    if (0 < pVVar13->nSize) {
      local_38 = (size_t)iVar17;
      uVar21 = 0;
      do {
        pVVar3 = pVVar13->pArray;
        if (pVVar3[uVar21].nSize != 0) {
          memset(pvVar11,0x2d,local_38);
          iVar9 = pVVar3[uVar21].nSize;
          if (1 < iVar9) {
            lVar12 = 1;
            do {
              uVar18 = pVVar3[uVar21].pArray[lVar12];
              if ((int)uVar18 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf2,"int Abc_Lit2Var(int)");
              }
              if (iVar17 <= (int)(uVar18 >> 1)) {
                __assert_fail("Abc_Lit2Var(Lit) < nObjs",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                              ,0x20a,"void Fx_PrintMatrix(Fx_Man_t *)");
              }
              *(byte *)((long)pvVar11 + (ulong)(uVar18 >> 1)) = (byte)uVar18 & 1 ^ 0x31;
              lVar12 = lVar12 + 1;
              iVar9 = pVVar3[uVar21].nSize;
            } while (lVar12 < iVar9);
          }
          if (iVar9 < 1) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("%6d : %s %4d\n",uVar21 & 0xffffffff,pvVar11,(ulong)(uint)*pVVar3[uVar21].pArray);
        }
        uVar21 = uVar21 + 1;
        pVVar13 = p->vCubes;
      } while ((long)uVar21 < (long)pVVar13->nSize);
    }
    if (pvVar11 != (void *)0x0) {
      free(pvVar11);
    }
    pVVar13 = p->vLits;
    if (0 < pVVar13->nSize) {
      uVar21 = 0;
      do {
        pVVar3 = pVVar13->pArray;
        printf("%c : ",(ulong)(uint)(int)(char)(((uVar21 & 1) == 0) * ' ' + (char)(uVar21 >> 1) +
                                               'A'));
        printf("Vector has %d entries: {",(ulong)(uint)pVVar3[uVar21].nSize);
        if (0 < pVVar3[uVar21].nSize) {
          lVar12 = 0;
          do {
            printf(" %d",(ulong)(uint)pVVar3[uVar21].pArray[lVar12]);
            lVar12 = lVar12 + 1;
          } while (lVar12 < pVVar3[uVar21].nSize);
        }
        puts(" }");
        uVar21 = uVar21 + 1;
        pVVar13 = p->vLits;
      } while ((long)uVar21 < (long)pVVar13->nSize);
    }
    if (0 < p->vWeights->nSize) {
      iVar9 = 0;
      do {
        Fx_PrintDiv(p,iVar9);
        iVar9 = iVar9 + 1;
      } while (iVar9 < p->vWeights->nSize);
    }
  }
  iVar9 = local_44;
  if (local_48 != 0) {
    iVar17 = clock_gettime(3,&local_58);
    if (iVar17 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar12 - local_40);
  }
  iVar17 = clock_gettime(3,&local_58);
  if (iVar17 < 0) {
    aVar16 = -1;
  }
  else {
    aVar16 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
  }
  p->timeStart = aVar16;
  if (0 < iVar9) {
    iVar17 = 0;
    do {
      pVVar4 = p->vPrio;
      iVar19 = pVVar4->nSize;
      if (iVar19 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0x88,"int Vec_QueSize(Vec_Que_t *)");
      }
      fVar24 = -1e+09;
      if (iVar19 != 1) {
        if (*pVVar4->pCostsFlt == (float *)0x0) {
          fVar24 = (float)pVVar4->pHeap[1];
        }
        else {
          fVar24 = (*pVVar4->pCostsFlt)[pVVar4->pHeap[1]];
        }
      }
      if (fVar24 <= 0.0) break;
      if (iVar19 == 1) {
        __assert_fail("p->nSize > 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                      ,0xed,"int Vec_QuePop(Vec_Que_t *)");
      }
      piVar5 = pVVar4->pHeap;
      fWarning = pVVar4->pOrder;
      iVar19 = piVar5[1];
      fWarning[iVar19] = -1;
      iVar10 = pVVar4->nSize;
      pVVar4->nSize = iVar10 + -1;
      if (iVar10 + -1 == 1) {
        piVar5[1] = -1;
      }
      else {
        iVar9 = piVar5[(long)iVar10 + -1];
        piVar5[(long)iVar10 + -1] = -1;
        piVar5[1] = iVar9;
        fWarning[iVar9] = 1;
        pfVar6 = *pVVar4->pCostsFlt;
        if (pfVar6 == (float *)0x0) {
          fVar24 = (float)iVar9;
        }
        else {
          fVar24 = pfVar6[iVar9];
        }
        iVar10 = pVVar4->nSize;
        uVar18 = 1;
        if (2 < iVar10) {
          uVar14 = 2;
          uVar18 = 1;
          do {
            uVar20 = uVar14 | 1;
            uVar22 = uVar14;
            if ((int)uVar20 < iVar10) {
              if (pfVar6 == (float *)0x0) {
                fVar25 = (float)piVar5[(int)uVar14];
              }
              else {
                fVar25 = pfVar6[piVar5[(int)uVar14]];
              }
              if (pfVar6 == (float *)0x0) {
                fVar26 = (float)piVar5[(int)uVar20];
              }
              else {
                fVar26 = pfVar6[piVar5[(int)uVar20]];
              }
              if (fVar25 < fVar26) {
                uVar22 = uVar20;
              }
            }
            if (iVar10 <= (int)uVar22) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar10 = piVar5[(int)uVar22];
            if (pfVar6 == (float *)0x0) {
              fVar25 = (float)iVar10;
            }
            else {
              fVar25 = pfVar6[iVar10];
            }
            if (fVar25 <= fVar24) break;
            piVar5[(int)uVar18] = iVar10;
            fWarning[iVar10] = uVar18;
            uVar14 = uVar22 * 2;
            iVar10 = pVVar4->nSize;
            uVar18 = uVar22;
          } while ((int)uVar14 < iVar10);
        }
        piVar5[(int)uVar18] = iVar9;
        fWarning[iVar9] = uVar18;
        iVar9 = local_44;
      }
      if (fVeryVerbose != 0) {
        Fx_PrintDiv(p,iVar19);
        fWarning = extraout_RDX;
      }
      Fx_ManUpdate(p,iVar19,fWarning);
      iVar17 = iVar17 + 1;
    } while (iVar17 != iVar9);
  }
  if (local_48 != 0) {
    iVar9 = clock_gettime(3,&local_58);
    if (iVar9 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = local_58.tv_nsec / 1000 + local_58.tv_sec * 1000000;
    }
    Fx_PrintStats(p,lVar12 - local_40);
  }
  Fx_ManStop(p);
  if (vCubes->nSize < 1) {
    uVar18 = 0;
  }
  else {
    lVar12 = 0;
    lVar23 = 8;
    uVar18 = 0;
    do {
      pVVar3 = vCubes->pArray;
      if (*(int *)((long)pVVar3 + lVar23 + -4) < 1) {
        pvVar11 = *(void **)((long)&pVVar3->nCap + lVar23);
        if (pvVar11 != (void *)0x0) {
          free(pvVar11);
          *(undefined8 *)((long)&pVVar3->nCap + lVar23) = 0;
        }
      }
      else {
        puVar1 = (undefined4 *)((long)&pVVar3->nCap + lVar23);
        lVar15 = (long)(int)uVar18;
        uVar18 = uVar18 + 1;
        iVar9 = puVar1[-1];
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        pVVar3 = pVVar3 + lVar15;
        pVVar3->nCap = puVar1[-2];
        pVVar3->nSize = iVar9;
        *(undefined4 *)&pVVar3->pArray = uVar7;
        *(undefined4 *)((long)&pVVar3->pArray + 4) = uVar8;
      }
      lVar12 = lVar12 + 1;
      lVar23 = lVar23 + 0x10;
    } while (lVar12 < vCubes->nSize);
  }
  iVar9 = vCubes->nSize;
  if ((int)uVar18 < iVar9) {
    if ((int)uVar18 < 0) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                    ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
    }
    lVar12 = (ulong)uVar18 << 4;
    uVar14 = uVar18;
    do {
      puVar2 = (undefined8 *)((long)&vCubes->pArray->nCap + lVar12);
      *puVar2 = 0;
      puVar2[1] = 0;
      iVar9 = vCubes->nSize;
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while ((int)uVar14 < iVar9);
  }
  if (iVar9 < (int)uVar18) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                  ,0xfa,"void Vec_WecShrink(Vec_Wec_t *, int)");
  }
  vCubes->nSize = uVar18;
  return 1;
}

Assistant:

int Fx_FastExtract( Vec_Wec_t * vCubes, int ObjIdMax, int nNewNodesMax, int LitCountMax, int fCanonDivs, int fVerbose, int fVeryVerbose )
{
    int fVeryVeryVerbose = 0;
    int i, iDiv, fWarning = 0;
    Fx_Man_t * p;
    abctime clk = Abc_Clock();
    // initialize the data-structure
    p = Fx_ManStart( vCubes );
    p->LitCountMax = LitCountMax;
    p->fCanonDivs = fCanonDivs;
    Fx_ManCreateLiterals( p, ObjIdMax );
    Fx_ManComputeLevel( p );
    Fx_ManCreateDivisors( p );
    if ( fVeryVerbose )
        Fx_PrintMatrix( p );
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    // perform extraction
    p->timeStart = Abc_Clock();
    for ( i = 0; i < nNewNodesMax && Vec_QueTopPriority(p->vPrio) > 0.0; i++ )
    {
        iDiv = Vec_QuePop(p->vPrio);
        if ( fVeryVerbose )
            Fx_PrintDiv( p, iDiv );
        Fx_ManUpdate( p, iDiv, &fWarning );
        if ( fVeryVeryVerbose )
            Fx_PrintMatrix( p );
    }
    if ( fVerbose )
        Fx_PrintStats( p, Abc_Clock() - clk );
    Fx_ManStop( p );
    // return the result
    Vec_WecRemoveEmpty( vCubes );
    return 1;
}